

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::WriteLockedUTXO(WalletBatch *this,COutPoint *output)

{
  byte bVar1;
  transaction_identifier<false> *in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  undefined1 fOverwrite;
  uchar *value;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  WalletBatch *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_74;
  uchar local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __x = &local_74;
  std::make_pair<transaction_identifier<false>const&,unsigned_int_const&>(in_RDI,(uint *)__x);
  fOverwrite = (undefined1)((ulong)in_RDI >> 0x38);
  value = local_50;
  std::make_pair<std::__cxx11::string_const&,std::pair<transaction_identifier<false>,unsigned_int>>
            (__x,(pair<transaction_identifier<false>,_unsigned_int> *)in_stack_ffffffffffffff48);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>,unsigned_char>
                    (in_stack_ffffffffffffff70,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
                      *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),value,
                     (bool)fOverwrite);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  ::~pair(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteLockedUTXO(const COutPoint& output)
{
    return WriteIC(std::make_pair(DBKeys::LOCKED_UTXO, std::make_pair(output.hash, output.n)), uint8_t{'1'});
}